

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprIsConstant(Expr *p)

{
  uint uVar1;
  Walker w;
  Walker WStack_38;
  
  WStack_38.eCode = 1;
  WStack_38.xExprCallback = exprNodeIsConstant;
  WStack_38.xSelectCallback = sqlite3SelectWalkFail;
  WStack_38.u.n = 0;
  if (p == (Expr *)0x0) {
    uVar1 = 1;
  }
  else {
    walkExpr(&WStack_38,p);
    uVar1 = (uint)WStack_38.eCode;
  }
  return uVar1;
}

Assistant:

static int exprIsConst(Expr *p, int initFlag, int iCur){
  Walker w;
  w.eCode = initFlag;
  w.xExprCallback = exprNodeIsConstant;
  w.xSelectCallback = sqlite3SelectWalkFail;
#ifdef SQLITE_DEBUG
  w.xSelectCallback2 = sqlite3SelectWalkAssert2;
#endif
  w.u.iCur = iCur;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}